

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void __thiscall
ft::deque<int,_ft::allocator<int>_>::deque
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *other)

{
  constDequeIterator<int,_64UL> local_70;
  undefined **local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  map_pointer local_28;
  
  (this->m_start)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_0010ecc8;
  (this->m_finish)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_0010ecc8;
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  dequeInit(this,other->m_size);
  if ((deque<int,_ft::allocator<int>_> *)&stack0xffffffffffffffb8 != other) {
    local_40 = (other->m_start).m_cur;
    local_38 = (other->m_start).m_first;
    local_30 = (other->m_start).m_last;
    local_28 = (other->m_start).m_node;
  }
  local_48 = &PTR__dequeIterator_0010ed10;
  if (&other->m_finish != &local_70.super_dequeIterator<int,_64UL>) {
    local_70.super_dequeIterator<int,_64UL>.m_cur = (other->m_finish).m_cur;
    local_70.super_dequeIterator<int,_64UL>.m_first = (other->m_finish).m_first;
    local_70.super_dequeIterator<int,_64UL>.m_last = (other->m_finish).m_last;
    local_70.super_dequeIterator<int,_64UL>.m_node = (other->m_finish).m_node;
  }
  local_70.super_dequeIterator<int,_64UL>._vptr_dequeIterator =
       (_func_int **)&PTR__dequeIterator_0010ed10;
  deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)this,
             (constDequeIterator<int,_64UL> *)&stack0xffffffffffffffb8,&local_70,(type *)0x0);
  return;
}

Assistant:

deque(deque const & other):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->dequeInit(other.size());
		this->assign(other.begin(), other.end());
	}